

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::~RWSocket(RWSocket *this)

{
  AlloterWrap *this_00;
  shared_ptr<cppnet::Dispatcher> dispatcher;
  __shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_00129378;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&DAT_00129438;
  std::__shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_read_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((this_00 != (AlloterWrap *)0x0) && (this->_event != (Event *)0x0)) {
    AlloterWrap::PoolDelete<cppnet::Event>(this_00,&this->_event);
  }
  if (this->_timer_id != 0) {
    std::__shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,&(this->super_Socket)._dispatcher);
    if (local_20._M_ptr != (Dispatcher *)0x0) {
      Dispatcher::StopTimer(local_20._M_ptr,this->_timer_id);
    }
    this->_timer_id = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_block_pool).
              super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_read_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
              super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Socket::~Socket(&this->super_Socket);
  return;
}

Assistant:

RWSocket::~RWSocket() {
    _write_buffer.reset();
    _read_buffer.reset();
    if (_alloter && _event) {
        _alloter->PoolDelete(_event);
    }
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}